

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderAtomicOpTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::ShaderAtomicExchangeCase::getInputs
          (ShaderAtomicExchangeCase *this,int numValues,int stride,void *inputs)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  
  uVar3 = (this->super_ShaderAtomicOpCase).m_workGroupSize.m_data[1] *
          (this->super_ShaderAtomicOpCase).m_workGroupSize.m_data[2] *
          (this->super_ShaderAtomicOpCase).m_workGroupSize.m_data[0];
  iVar1 = numValues / (int)uVar3;
  iVar2 = 0;
  uVar4 = 0;
  if (0 < (int)uVar3) {
    uVar4 = (ulong)uVar3;
  }
  if (iVar1 < 1) {
    iVar1 = 0;
  }
  for (iVar5 = 0; iVar5 != iVar1; iVar5 = iVar5 + 1) {
    uVar7 = 0;
    iVar6 = iVar2;
    while (uVar4 != uVar7) {
      uVar7 = uVar7 + 1;
      *(int *)((long)inputs + (long)iVar6) = (int)uVar7;
      iVar6 = iVar6 + stride;
    }
    iVar2 = iVar2 + uVar3 * stride;
  }
  return;
}

Assistant:

void getInputs (int numValues, int stride, void* inputs) const
	{
		const int	workGroupSize	= (int)product(m_workGroupSize);
		const int	numWorkGroups	= numValues/workGroupSize;

		for (int groupNdx = 0; groupNdx < numWorkGroups; groupNdx++)
		{
			const int groupOffset = groupNdx*workGroupSize;

			for (int localNdx = 0; localNdx < workGroupSize; localNdx++)
				*(int*)((deUint8*)inputs + stride*(groupOffset+localNdx)) = localNdx+1;
		}
	}